

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void wstran_pipe_send(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nni_msg *msg;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)arg);
  _Var1 = nni_aio_start(aio,wstran_pipe_send_cancel,arg);
  if (_Var1) {
    *(nni_aio **)((long)arg + 0x30) = aio;
    msg = nni_aio_get_msg(aio);
    nni_aio_set_msg((nni_aio *)((long)arg + 0x40),msg);
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nng_stream_send(*(nng_stream **)((long)arg + 0x3d0),(nni_aio *)((long)arg + 0x40));
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
wstran_pipe_send(void *arg, nni_aio *aio)
{
	ws_pipe *p = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&p->mtx);
	if (!nni_aio_start(aio, wstran_pipe_send_cancel, p)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}
	p->user_txaio = aio;
	nni_aio_set_msg(&p->txaio, nni_aio_get_msg(aio));
	nni_aio_set_msg(aio, NULL);

	nng_stream_send(p->ws, &p->txaio);
	nni_mtx_unlock(&p->mtx);
}